

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool __thiscall
cmStringCommand::HandleFindCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  string *name;
  pointer pcVar1;
  cmMakefile *this_00;
  int iVar2;
  pointer pbVar3;
  long lVar4;
  pointer pbVar5;
  bool bVar6;
  ostringstream s;
  long *local_1c0;
  long local_1b0 [2];
  string local_1a0 [3];
  ios_base local_130 [264];
  
  pbVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (((long)pbVar3 - (long)pbVar5 >> 5) - 6U < 0xfffffffffffffffe) {
    local_1a0[0]._M_dataplus._M_p = (pointer)&local_1a0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a0,"sub-command FIND requires 3 or 4 parameters.","");
    cmCommand::SetError(&this->super_cmCommand,local_1a0);
  }
  else {
    if ((long)pbVar3 - (long)pbVar5 == 0xa0) {
      iVar2 = std::__cxx11::string::compare((char *)(pbVar5 + 4));
      bVar6 = iVar2 == 0;
      pbVar5 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      bVar6 = false;
    }
    if ((long)pbVar3 - (long)pbVar5 == 0xa0) {
      iVar2 = std::__cxx11::string::compare((char *)(pbVar5 + 4));
      if (iVar2 != 0) {
        local_1a0[0]._M_dataplus._M_p = (pointer)&local_1a0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a0,"sub-command FIND: unknown last parameter","");
        cmCommand::SetError(&this->super_cmCommand,local_1a0);
        goto LAB_0036b18e;
      }
      pbVar5 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    name = pbVar5 + 3;
    iVar2 = std::__cxx11::string::compare((char *)name);
    if (iVar2 != 0) {
      pcVar1 = pbVar5[2]._M_dataplus._M_p;
      if (bVar6) {
        lVar4 = std::__cxx11::string::rfind((char *)(pbVar5 + 1),(ulong)pcVar1,0xffffffffffffffff);
      }
      else {
        lVar4 = std::__cxx11::string::find((char *)(pbVar5 + 1),(ulong)pcVar1,0);
      }
      if (lVar4 == -1) {
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,"-1");
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
        this_00 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::AddDefinition(this_00,name,(char *)local_1c0);
        if (local_1c0 != local_1b0) {
          operator_delete(local_1c0,local_1b0[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
        std::ios_base::~ios_base(local_130);
      }
      return true;
    }
    local_1a0[0]._M_dataplus._M_p = (pointer)&local_1a0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a0,
               "sub-command FIND does not allow one to select REVERSE as the output variable.  Maybe you missed the actual output variable?"
               ,"");
    cmCommand::SetError(&this->super_cmCommand,local_1a0);
  }
LAB_0036b18e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0[0]._M_dataplus._M_p != &local_1a0[0].field_2) {
    operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool cmStringCommand::HandleFindCommand(std::vector<std::string> const& args)
{
  // check if all required parameters were passed
  if (args.size() < 4 || args.size() > 5) {
    this->SetError("sub-command FIND requires 3 or 4 parameters.");
    return false;
  }

  // check if the reverse flag was set or not
  bool reverseMode = false;
  if (args.size() == 5 && args[4] == "REVERSE") {
    reverseMode = true;
  }

  // if we have 5 arguments the last one must be REVERSE
  if (args.size() == 5 && args[4] != "REVERSE") {
    this->SetError("sub-command FIND: unknown last parameter");
    return false;
  }

  // local parameter names.
  const std::string& sstring = args[1];
  const std::string& schar = args[2];
  const std::string& outvar = args[3];

  // ensure that the user cannot accidentally specify REVERSE as a variable
  if (outvar == "REVERSE") {
    this->SetError("sub-command FIND does not allow one to select REVERSE as "
                   "the output variable.  "
                   "Maybe you missed the actual output variable?");
    return false;
  }

  // try to find the character and return its position
  size_t pos;
  if (!reverseMode) {
    pos = sstring.find(schar);
  } else {
    pos = sstring.rfind(schar);
  }
  if (std::string::npos != pos) {
    std::ostringstream s;
    s << pos;
    this->Makefile->AddDefinition(outvar, s.str().c_str());
    return true;
  }

  // the character was not found, but this is not really an error
  this->Makefile->AddDefinition(outvar, "-1");
  return true;
}